

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

glist_t hash_table_tolist(hash_table_t *h,int32 *count)

{
  glist_t g;
  int iVar1;
  long lVar2;
  hash_entry_s *ptr;
  
  if (h->size < 1) {
    g = (glist_t)0x0;
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    g = (glist_t)0x0;
    do {
      if (h->table[lVar2].key != (char *)0x0) {
        ptr = h->table + lVar2;
        do {
          g = glist_add_ptr(g,ptr);
          iVar1 = iVar1 + 1;
          ptr = ptr->next;
        } while (ptr != (hash_entry_s *)0x0);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < h->size);
  }
  if (count != (int32 *)0x0) {
    *count = iVar1;
  }
  return g;
}

Assistant:

glist_t
hash_table_tolist(hash_table_t * h, int32 * count)
{
    glist_t g;
    hash_entry_t *e;
    int32 i, j;

    g = NULL;

    j = 0;
    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);

        if (e->key != NULL) {
            g = glist_add_ptr(g, (void *) e);
            j++;

            for (e = e->next; e; e = e->next) {
                g = glist_add_ptr(g, (void *) e);
                j++;
            }
        }
    }

    if (count)
        *count = j;

    return g;
}